

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

int xpath_normalize_space
              (lyxp_set **args,uint16_t arg_count,lyd_node *cur_node,lys_module *param_4,
              lyxp_set *set,int options)

{
  lyxp_set *plVar1;
  lyd_node *plVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  ulong uVar6;
  size_t __size;
  void *ptr;
  lyxp_set_node *plVar7;
  lys_node *plVar8;
  ushort uVar9;
  uint uVar10;
  char *pcVar11;
  long lVar12;
  ushort uVar13;
  ulong uVar14;
  byte bVar15;
  ly_ctx *ctx;
  int iVar16;
  
  if ((options & 0x1cU) == 0) {
    if (arg_count != 0) {
      set_fill_set(set,*args);
    }
    iVar5 = lyxp_set_cast(set,LYXP_SET_STRING,cur_node,param_4,options);
    iVar16 = -1;
    if (iVar5 == 0) {
      pcVar11 = (set->val).str;
      uVar10 = 0;
      bVar3 = false;
      do {
        uVar6 = (ulong)(uVar10 & 0xffff);
        uVar14 = (ulong)(byte)pcVar11[uVar6];
        bVar4 = false;
        if (uVar14 < 0x21) {
          if ((0x100002600U >> (uVar14 & 0x3f) & 1) == 0) {
            if (uVar14 == 0) {
              return 0;
            }
          }
          else if (((uVar6 == 0) || (bVar3)) || (bVar4 = true, pcVar11[uVar6 + 1] == '\0'))
          goto LAB_00180c1e;
        }
        bVar3 = bVar4;
        uVar10 = (uVar10 & 0xffff) + 1;
      } while( true );
    }
  }
  else {
    iVar16 = 0;
    if ((arg_count != 0) && (plVar1 = *args, plVar1->type == LYXP_SET_SNODE_SET)) {
      uVar10 = plVar1->used;
      do {
        uVar10 = uVar10 - 1;
        if ((plVar1->val).nodes[uVar10].pos == 1) {
          plVar2 = (plVar1->val).nodes[uVar10].node;
          iVar16 = 0;
          if (plVar2 == (lyd_node *)0x0) break;
          if ((*(LYS_NODE *)&plVar2->ht & (LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
            ctx = param_4->ctx;
            plVar8 = (lys_node *)strnodetype(*(LYS_NODE *)&plVar2->ht);
            pcVar11 = "Argument #1 of %s is a %s node \"%s\".";
          }
          else {
            iVar5 = warn_is_string_type((lys_type *)&plVar2[1].ht);
            if (iVar5 != 0) break;
            ctx = param_4->ctx;
            plVar8 = plVar2->schema;
            pcVar11 = "Argument #1 of %s is node \"%s\", not of string-type.";
          }
          iVar16 = 1;
          ly_log(ctx,LY_LLWRN,LY_SUCCESS,pcVar11,"xpath_normalize_space",plVar8);
          break;
        }
      } while (uVar10 != 0);
    }
    uVar10 = set->used;
    if ((ulong)uVar10 != 0) {
      lVar12 = 0;
      do {
        if (*(int *)((long)&((set->val).nodes)->pos + lVar12) == 1) {
          *(undefined4 *)((long)&((set->val).nodes)->pos + lVar12) = 0;
        }
        lVar12 = lVar12 + 0x10;
      } while ((ulong)uVar10 << 4 != lVar12);
    }
  }
  return iVar16;
LAB_00180c1e:
  __size = strlen(pcVar11);
  ptr = malloc(__size);
  if (ptr == (void *)0x0) {
LAB_00180d35:
    ly_log(param_4->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","xpath_normalize_space")
    ;
    return -1;
  }
  uVar13 = 0;
  uVar9 = 0;
  bVar3 = false;
LAB_00180c3d:
  bVar15 = pcVar11[uVar13];
  uVar6 = (ulong)bVar15;
  if (uVar6 < 0x21) {
    if ((0x100002600U >> (uVar6 & 0x3f) & 1) == 0) {
      bVar3 = false;
      if (uVar6 != 0) goto LAB_00180c7b;
      if (uVar9 == 0) {
        uVar9 = 0;
      }
      else {
        uVar6 = (ulong)*(byte *)((long)ptr + (ulong)(uVar9 - 1));
        if ((uVar6 < 0x21) && ((0x100002600U >> (uVar6 & 0x3f) & 1) != 0)) {
          uVar9 = uVar9 - 1;
        }
      }
      plVar7 = (lyxp_set_node *)ly_realloc(ptr,(ulong)uVar9 + 1);
      if (plVar7 != (lyxp_set_node *)0x0) {
        *(undefined1 *)((long)&plVar7->node + (ulong)uVar9) = 0;
        free((set->val).nodes);
        (set->val).nodes = plVar7;
        return 0;
      }
      goto LAB_00180d35;
    }
    bVar4 = !bVar3;
    bVar15 = 0x20;
    bVar3 = true;
    if (bVar4 && uVar13 != 0) goto LAB_00180c7b;
  }
  else {
    bVar3 = false;
LAB_00180c7b:
    *(byte *)((long)ptr + (ulong)uVar9) = bVar15;
    uVar9 = uVar9 + 1;
  }
  uVar13 = uVar13 + 1;
  goto LAB_00180c3d;
}

Assistant:

static int
xpath_normalize_space(struct lyxp_set **args, uint16_t arg_count, struct lyd_node *cur_node, struct lys_module *local_mod,
                      struct lyxp_set *set, int options)
{
    uint16_t i, new_used;
    char *new;
    int have_spaces = 0, space_before = 0, ret = EXIT_SUCCESS;
    struct lys_node_leaf *sleaf;

    if (options & LYXP_SNODE_ALL) {
        if (arg_count && (args[0]->type == LYXP_SET_SNODE_SET) && (sleaf = (struct lys_node_leaf *)warn_get_snode_in_ctx(args[0]))) {
            if (!(sleaf->nodetype & (LYS_LEAF | LYS_LEAFLIST))) {
                LOGWRN(local_mod->ctx, "Argument #1 of %s is a %s node \"%s\".", __func__, strnodetype(sleaf->nodetype), sleaf->name);
                ret = EXIT_FAILURE;
            } else if (!warn_is_string_type(&sleaf->type)) {
                LOGWRN(local_mod->ctx, "Argument #1 of %s is node \"%s\", not of string-type.", __func__, sleaf->name);
                ret = EXIT_FAILURE;
            }
        }
        set_snode_clear_ctx(set);
        return ret;
    }

    if (arg_count) {
        set_fill_set(set, args[0]);
    }
    if (lyxp_set_cast(set, LYXP_SET_STRING, cur_node, local_mod, options)) {
        return -1;
    }

    /* is there any normalization necessary? */
    for (i = 0; set->val.str[i]; ++i) {
        if (is_xmlws(set->val.str[i])) {
            if ((i == 0) || space_before || (!set->val.str[i + 1])) {
                have_spaces = 1;
                break;
            }
            space_before = 1;
        } else {
            space_before = 0;
        }
    }

    /* yep, there is */
    if (have_spaces) {
        /* it's enough, at least one character will go, makes space for ending '\0' */
        new = malloc(strlen(set->val.str) * sizeof(char));
        LY_CHECK_ERR_RETURN(!new, LOGMEM(local_mod->ctx), -1);
        new_used = 0;

        space_before = 0;
        for (i = 0; set->val.str[i]; ++i) {
            if (is_xmlws(set->val.str[i])) {
                if ((i == 0) || space_before) {
                    space_before = 1;
                    continue;
                } else {
                    space_before = 1;
                }
            } else {
                space_before = 0;
            }

            new[new_used] = (space_before ? ' ' : set->val.str[i]);
            ++new_used;
        }

        /* at worst there is one trailing space now */
        if (new_used && is_xmlws(new[new_used - 1])) {
            --new_used;
        }

        new = ly_realloc(new, (new_used + 1) * sizeof(char));
        LY_CHECK_ERR_RETURN(!new, LOGMEM(local_mod->ctx), -1);
        new[new_used] = '\0';

        free(set->val.str);
        set->val.str = new;
    }

    return EXIT_SUCCESS;
}